

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

void __thiscall Linker::Linker(Linker *this)

{
  EVP_PKEY_CTX *ctx;
  Linker *this_local;
  
  FastVector<ExternTypeInfo,_false,_false>::FastVector(&this->exTypes,0x80);
  FastVector<ExternMemberInfo,_false,_false>::FastVector(&this->exTypeExtra,0x100);
  FastVector<ExternConstantInfo,_false,_false>::FastVector(&this->exTypeConstants,0x100);
  FastVector<ExternVarInfo,_false,_false>::FastVector(&this->exVariables,0x80);
  FastVector<ExternFuncInfo,_false,_false>::FastVector(&this->exFunctions,0x100);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->exFunctionExplicitTypeArrayOffsets);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->exFunctionExplicitTypes);
  FastVector<ExternLocalInfo,_false,_false>::FastVector(&this->exLocals,0x400);
  FastVector<ExternModuleInfo,_false,_false>::FastVector(&this->exModules);
  FastVector<char,_false,_false>::FastVector(&this->exSymbols,0x2000);
  FastVector<char,_false,_false>::FastVector(&this->exSource);
  FastVector<char,_false,_false>::FastVector(&this->exImportPaths);
  FastVector<char,_false,_false>::FastVector(&this->exMainModuleName);
  FastVector<RegVmCmd,_false,_false>::FastVector(&this->exRegVmCode);
  FastVector<ExternSourceInfo,_false,_false>::FastVector(&this->exRegVmSourceInfo);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->exRegVmExecCount);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->exRegVmConstants);
  FastVector<unsigned_char,_false,_false>::FastVector(&this->exRegVmRegKillInfo);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->regVmJumpTargets,0x400);
  FastVector<RegVmCmd_*,_false,_false>::FastVector(&this->expiredRegVmCode);
  FastVector<unsigned_int_*,_false,_false>::FastVector(&this->expiredRegVmConstants);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->typeRemap);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->funcRemap);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->moduleRemap);
  HashMap<unsigned_int>::HashMap(&this->typeMap,(Allocator *)0x0);
  ctx = (EVP_PKEY_CTX *)0x0;
  HashMap<unsigned_int>::HashMap(&this->funcMap,(Allocator *)0x0);
  FastVector<unsigned_char,_false,_false>::FastVector(&this->fullLinkerData);
  this->globalVarSize = 0;
  HashMap<unsigned_int>::init(&this->typeMap,ctx);
  HashMap<unsigned_int>::init(&this->funcMap,ctx);
  this->debugOutputIndent = 0;
  NULLC::SetLinker(this);
  return;
}

Assistant:

Linker::Linker(): exTypes(128), exTypeExtra(256), exTypeConstants(256), exVariables(128), exFunctions(256), exLocals(1024), exSymbols(8192), regVmJumpTargets(1024)
{
	globalVarSize = 0;

	typeMap.init();
	funcMap.init();

	debugOutputIndent = 0;

	NULLC::SetLinker(this);
}